

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

void __thiscall
Js::JavascriptBigInt::InitFromCharDigits<char16_t>
          (JavascriptBigInt *this,char16_t *pChar,uint32 charLength,bool isNegative)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *this_00;
  Recycler *pRVar4;
  unsigned_long *ptr;
  unsigned_long **ppuVar5;
  double dVar6;
  undefined1 auVar7 [16];
  digit_t local_70;
  digit_t digitAdd;
  digit_t digitMul;
  TrackAllocData local_50;
  char16_t *local_28;
  char16_t *pCharLimit;
  bool isNegative_local;
  char16_t *pcStack_18;
  uint32 charLength_local;
  char16_t *pChar_local;
  JavascriptBigInt *this_local;
  
  pCharLimit._3_1_ = isNegative;
  pCharLimit._4_4_ = charLength;
  pcStack_18 = pChar;
  pChar_local = (char16_t *)this;
  if (pChar == (char16_t *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x94,"(pChar != 0)","pChar != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_28 = pcStack_18 + ((ulong)pCharLimit._4_4_ - 1);
  this->m_length = 0;
  this_00 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
  pRVar4 = ScriptContext::GetRecycler(this_00);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&unsigned_long::typeinfo,0,this->m_maxLength,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
             ,0x99);
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_50);
  ptr = Memory::AllocateArray<Memory::Recycler,unsigned_long,false>
                  ((Memory *)pRVar4,(Recycler *)Memory::Recycler::AllocLeaf,0,this->m_maxLength);
  Memory::WriteBarrierPtr<unsigned_long>::operator=(&this->m_digits,ptr);
  this->m_isNegative = (Type)(pCharLimit._3_1_ & 1);
  digitAdd = 1;
  local_70 = 0;
  do {
    if (local_28 <= pcStack_18) {
      if (digitAdd < 2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                    ,0xaa,"(1 < digitMul)","1 < digitMul");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      MulThenAdd(this,digitAdd,local_70);
      if (this->m_length == 0) {
        this->m_isNegative = false;
        this->m_length = 1;
        ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                            ((WriteBarrierPtr *)&this->m_digits);
        **ppuVar5 = 0;
      }
      return;
    }
    bVar2 = NumberUtilities::IsDigit((uint)(ushort)*pcStack_18);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                  ,0xa0,"(NumberUtilities::IsDigit(*pChar))",
                                  "NumberUtilities::IsDigit(*pChar)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    auVar7._8_4_ = (int)(digitAdd >> 0x20);
    auVar7._0_8_ = digitAdd;
    auVar7._12_4_ = 0x45300000;
    dVar6 = (auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)digitAdd) - 4503599627370496.0);
    if ((dVar6 == 1000000000.0) && (!NAN(dVar6))) {
      MulThenAdd(this,digitAdd,local_70);
      digitAdd = 1;
      local_70 = 0;
    }
    digitAdd = digitAdd * 10;
    local_70 = (local_70 * 10 + (ulong)(ushort)*pcStack_18) - 0x30;
    pcStack_18 = pcStack_18 + 1;
  } while( true );
}

Assistant:

void JavascriptBigInt::InitFromCharDigits(const EncodedChar *pChar, uint32 charLength, bool isNegative)
    {
        Assert(charLength >= 0);
        Assert(pChar != 0);

        const EncodedChar *pCharLimit = pChar + charLength - 1;//'n' at the end

        m_length = 0;
        m_digits = RecyclerNewArrayLeaf(this->GetScriptContext()->GetRecycler(), digit_t, m_maxLength);
        m_isNegative = isNegative;

        digit_t digitMul = 1;
        digit_t digitAdd = 0;
        for (; pChar < pCharLimit; pChar++)
        {
            Assert(NumberUtilities::IsDigit(*pChar));
            if (digitMul == 1e9)
            {
                MulThenAdd(digitMul, digitAdd);
                digitMul = 1;
                digitAdd = 0;
            }
            digitMul *= 10;
            digitAdd = digitAdd * 10 + *pChar - '0';
        }
        Assert(1 < digitMul);
        MulThenAdd(digitMul, digitAdd);

        // make sure this is no negative zero
        if (m_length == 0)
        {
            m_isNegative = false;
            m_length = 1;
            m_digits[0] = 0;
        }
    }